

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc-attack-detector.c
# Opt level: O1

_Bool detect_attack(crcda_ctx *ctx,uchar *buf,uint32_t len,uchar *IV)

{
  ushort uVar1;
  _Bool _Var2;
  uint16_t *puVar3;
  long *plVar4;
  uint8_t *p;
  uint16_t uVar5;
  uint uVar6;
  uint8_t *p_1;
  uint *S;
  uint uVar7;
  long *S_00;
  
  if ((0x40000 < len) || ((len & 7) != 0)) {
    __assert_fail("!(len > (SSH_MAXBLOCKS * SSH_BLOCKSIZE) || len % SSH_BLOCKSIZE != 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/crc-attack-detector.c"
                  ,0x70,
                  "_Bool detect_attack(struct crcda_ctx *, const unsigned char *, uint32_t, const unsigned char *)"
                 );
  }
  uVar7 = ctx->n;
  do {
    uVar6 = uVar7;
    uVar7 = uVar6 * 4;
  } while (uVar6 < (len >> 4) + (len >> 3));
  if (ctx->h == (uint16_t *)0x0) {
    ctx->n = uVar6;
    puVar3 = (uint16_t *)safemalloc((ulong)uVar6,2,0);
  }
  else {
    if (uVar6 <= ctx->n) goto LAB_00120aa1;
    ctx->n = uVar6;
    puVar3 = (uint16_t *)saferealloc(ctx->h,(ulong)uVar6,2);
  }
  ctx->h = puVar3;
LAB_00120aa1:
  if (len < 0x39) {
    if (len != 0) {
      S_00 = (long *)buf;
      do {
        if ((IV != (uchar *)0x0) && (*S_00 == *(long *)IV)) {
          _Var2 = check_crc((uint8_t *)S_00,buf,len,IV);
          if (!_Var2) {
            return false;
          }
          return true;
        }
        plVar4 = (long *)buf;
        if (buf < S_00) {
          do {
            if (*S_00 == *plVar4) {
              _Var2 = check_crc((uint8_t *)S_00,buf,len,IV);
              if (_Var2) {
                return true;
              }
              break;
            }
            plVar4 = plVar4 + 1;
          } while (plVar4 < S_00);
        }
        S_00 = S_00 + 1;
      } while (S_00 < buf + len);
    }
    return false;
  }
  memset(ctx->h,0xff,(ulong)ctx->n * 2);
  if (IV != (uchar *)0x0) {
    uVar7 = *(uint *)IV;
    ctx->h[ctx->n - 1 &
           (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)] =
         0xfffe;
  }
  uVar5 = 0;
  S = (uint *)buf;
LAB_00120b4a:
  uVar7 = *S;
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  do {
    uVar7 = uVar7 & ctx->n - 1;
    uVar1 = ctx->h[uVar7];
    if (uVar1 == 0xfffe) {
      if (IV == (uchar *)0x0) {
        __assert_fail("IV",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/crc-attack-detector.c"
                      ,0x9a,
                      "_Bool detect_attack(struct crcda_ctx *, const unsigned char *, uint32_t, const unsigned char *)"
                     );
      }
      if (*(long *)S == *(long *)IV) break;
    }
    else {
      if (uVar1 == 0xffff) goto LAB_00120ba7;
      if (*(long *)S == *(long *)(buf + (ulong)uVar1 * 8)) break;
    }
    uVar7 = uVar7 + 1;
  } while( true );
  _Var2 = check_crc((uint8_t *)S,buf,len,IV);
  if (_Var2) {
    return true;
  }
LAB_00120ba7:
  ctx->h[uVar7] = uVar5;
  S = S + 2;
  uVar5 = uVar5 + 1;
  if (buf + len <= S) {
    return false;
  }
  goto LAB_00120b4a;
}

Assistant:

bool detect_attack(struct crcda_ctx *ctx,
                   const unsigned char *buf, uint32_t len,
                   const unsigned char *IV)
{
    register uint32_t i, j;
    uint32_t l;
    register const uint8_t *c;
    const uint8_t *d;

    assert(!(len > (SSH_MAXBLOCKS * SSH_BLOCKSIZE) ||
             len % SSH_BLOCKSIZE != 0));
    for (l = ctx->n; l < HASH_FACTOR(len / SSH_BLOCKSIZE); l = l << 2)
        ;

    if (ctx->h == NULL) {
        ctx->n = l;
        ctx->h = snewn(ctx->n, uint16_t);
    } else {
        if (l > ctx->n) {
            ctx->n = l;
            ctx->h = sresize(ctx->h, ctx->n, uint16_t);
        }
    }

    if (len <= HASH_MINBLOCKS) {
        for (c = buf; c < buf + len; c += SSH_BLOCKSIZE) {
            if (IV && (!CMP(c, IV))) {
                if ((check_crc(c, buf, len, IV)))
                    return true;          /* attack detected */
                else
                    break;
            }
            for (d = buf; d < c; d += SSH_BLOCKSIZE) {
                if (!CMP(c, d)) {
                    if ((check_crc(c, buf, len, IV)))
                        return true;      /* attack detected */
                    else
                        break;
                }
            }
        }
        return false;                  /* ok */
    }
    memset(ctx->h, HASH_UNUSEDCHAR, ctx->n * HASH_ENTRYSIZE);

    if (IV)
        ctx->h[HASH(IV) & (ctx->n - 1)] = HASH_IV;

    for (c = buf, j = 0; c < (buf + len); c += SSH_BLOCKSIZE, j++) {
        for (i = HASH(c) & (ctx->n - 1); ctx->h[i] != HASH_UNUSED;
             i = (i + 1) & (ctx->n - 1)) {
            if (ctx->h[i] == HASH_IV) {
                assert(IV); /* or we wouldn't have stored HASH_IV above */
                if (!CMP(c, IV)) {
                    if (check_crc(c, buf, len, IV))
                        return true;      /* attack detected */
                    else
                        break;
                }
            } else if (!CMP(c, buf + ctx->h[i] * SSH_BLOCKSIZE)) {
                if (check_crc(c, buf, len, IV))
                    return true;          /* attack detected */
                else
                    break;
            }
        }
        ctx->h[i] = j;
    }
    return false;                          /* ok */
}